

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsSealed
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  IndexPropertyDescriptorMap *pIVar5;
  IndexPropertyDescriptor *pIVar6;
  ES5Array *arr;
  IndexPropertyDescriptor *descriptor;
  int i;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsSealed
                    (&this->super_DictionaryTypeHandlerBase<int>,instance);
  if (BVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    descriptor._4_4_ = 0;
    while( true ) {
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      iVar4 = IndexPropertyDescriptorMap::Count(pIVar5);
      if (iVar4 <= descriptor._4_4_) break;
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      pIVar6 = IndexPropertyDescriptorMap::GetReferenceAt(pIVar5,descriptor._4_4_);
      if (((pIVar6->Attributes & 8) == 0) && ((pIVar6->Attributes & 2) != 0)) {
        return 0;
      }
      descriptor._4_4_ = descriptor._4_4_ + 1;
    }
    bVar1 = GetDataItemAttributes(this);
    if ((bVar1 & 2) != 0) {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
      bVar2 = HasAnyDataItemNotInMap(this,arr);
      if (bVar2) {
        return 0;
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (!__super::IsSealed(instance))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);
            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                //[[Configurable]] must be false for all properties.
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & PropertyConfigurable)
        {
            if (HasAnyDataItemNotInMap(VarTo<ES5Array>(instance)))
            {
                return false;
            }
        }

        return true;
    }